

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyLexInit(SyLex *pLex,SySet *pSet,ProcTokenizer xTokenizer,void *pUserData)

{
  SyStream *pStream;
  void *pUserData_local;
  ProcTokenizer xTokenizer_local;
  SySet *pSet_local;
  SyLex *pLex_local;
  
  pLex->pTokenSet = (SySet *)0x0;
  if (pSet != (SySet *)0x0) {
    if (pSet->eSize != 0x20) {
      return -9;
    }
    pLex->pTokenSet = pSet;
  }
  pLex->xTokenizer = xTokenizer;
  pLex->pUserData = pUserData;
  (pLex->sStream).nLine = 1;
  (pLex->sStream).nIgn = 0;
  (pLex->sStream).zEnd = (uchar *)0x0;
  (pLex->sStream).zText = (uchar *)0x0;
  (pLex->sStream).pSet = pSet;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyLexInit(SyLex *pLex, SySet *pSet, ProcTokenizer xTokenizer, void *pUserData)
{
	SyStream *pStream;
#if defined (UNTRUST)
	if ( pLex == 0 || xTokenizer == 0 ){
		return SXERR_CORRUPT;
	}
#endif
	pLex->pTokenSet = 0;
	/* Initialize lexer fields */
	if( pSet ){
		if ( SySetElemSize(pSet) != sizeof(SyToken) ){
			return SXERR_INVALID;
		}
		pLex->pTokenSet = pSet;
	}
	pStream = &pLex->sStream;
	pLex->xTokenizer = xTokenizer;
	pLex->pUserData = pUserData;
	
	pStream->nLine = 1;
	pStream->nIgn  = 0;
	pStream->zText = pStream->zEnd = 0;
	pStream->pSet  = pSet;
	return SXRET_OK;
}